

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

void sort_5_4::bubble_sort_1(int *a,int n)

{
  bool bVar1;
  int local_20;
  int local_1c;
  int j;
  int i;
  int f;
  int n_local;
  int *a_local;
  
  bVar1 = true;
  for (local_1c = 0; local_1c < n && bVar1; local_1c = local_1c + 1) {
    bVar1 = false;
    for (local_20 = local_1c; local_20 < n; local_20 = local_20 + 1) {
      if (a[local_20] < a[local_1c]) {
        swap_(a + local_20,a + local_1c);
        bVar1 = true;
      }
    }
  }
  return;
}

Assistant:

void bubble_sort_1(int *a, int n) {
        int f = 1;
        for (int i = 0; i < n && f == 1; i++) {
            f = 0;
            for (int j = i; j < n; j++) {
                if (a[j] < a[i]) {
                    swap_(&a[j], &a[i]);
                    f = 1;
                }
            }
        }
    }